

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O2

bool __thiscall AMovingCamera::Interpolate(AMovingCamera *this)

{
  TObjPtr<AActor> *obj;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  AActor *pAVar7;
  AActor *pAVar8;
  _func_int **local_38;
  PClass *pPStack_30;
  
  obj = &(this->super_APathFollower).super_AActor.tracer;
  pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
  bVar6 = APathFollower::Interpolate(&this->super_APathFollower);
  if (bVar6 && pAVar7 != (AActor *)0x0) {
    pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
    AActor::AngleTo((AActor *)&stack0xffffffffffffffc8,(AActor *)this,SUB81(pAVar7,0));
    (this->super_APathFollower).super_AActor.Angles.Yaw.Degrees = (double)local_38;
    bVar6 = true;
    if (((this->super_APathFollower).super_AActor.args[2] & 4) != 0) {
      dVar1 = (this->super_APathFollower).super_AActor.__Pos.Z;
      dVar3 = (this->super_APathFollower).super_AActor.__Pos.X;
      dVar4 = (this->super_APathFollower).super_AActor.__Pos.Y;
      pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
      pAVar8 = GC::ReadBarrier<AActor>((AActor **)obj);
      dVar2 = pAVar8->Height;
      local_38 = (_func_int **)(dVar3 - (pAVar7->__Pos).X);
      pPStack_30 = (PClass *)(dVar4 - (pAVar7->__Pos).Y);
      dVar3 = (pAVar7->__Pos).Z;
      dVar4 = TVector2<double>::Length((TVector2<double> *)&stack0xffffffffffffffc8);
      dVar5 = 0.0;
      if ((dVar4 != 0.0) || (NAN(dVar4))) {
        dVar5 = c_atan2(dVar1 - (dVar2 * 0.5 + dVar3),dVar4);
        dVar5 = dVar5 * 57.29577951308232;
      }
      (this->super_APathFollower).super_AActor.Angles.Pitch.Degrees = dVar5;
    }
  }
  else {
    bVar6 = pAVar7 == (AActor *)0x0 && bVar6;
  }
  return bVar6;
}

Assistant:

bool AMovingCamera::Interpolate ()
{
	if (tracer == NULL)
		return Super::Interpolate ();

	if (Super::Interpolate ())
	{
		Angles.Yaw = AngleTo(tracer, true);

		if (args[2] & 4)
		{ // Also aim camera's pitch;
			DVector3 diff = Pos() - tracer->PosPlusZ(tracer->Height / 2);
			double dist = diff.XY().Length();
			Angles.Pitch = dist != 0.f ? VecToAngle(dist, diff.Z) : 0.;
		}

		return true;
	}
	return false;
}